

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::TabBarQueueReorderFromMousePos
               (ImGuiTabBar *tab_bar,ImGuiTabItem *src_tab,ImVec2 mouse_pos)

{
  float fVar1;
  ImGuiTabItem *pIVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  int iVar8;
  ulong uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  ulong uVar7;
  
  fVar10 = mouse_pos.x;
  if ((tab_bar->Flags & 1) != 0) {
    fVar11 = 0.0;
    if ((src_tab->Flags & 0xc0U) == 0) {
      fVar11 = tab_bar->ScrollingTarget;
    }
    fVar11 = (tab_bar->BarRect).Min.x - fVar11;
    fVar12 = src_tab->Offset + fVar11;
    pIVar2 = (tab_bar->Tabs).Data;
    uVar5 = ((long)src_tab - (long)pIVar2) / 0x28;
    uVar4 = uVar5 & 0xffffffff;
    uVar9 = uVar5 & 0xffffffff;
    while( true ) {
      uVar7 = uVar4;
      iVar8 = (int)uVar9;
      iVar6 = (int)uVar7;
      if ((iVar6 < 0) || ((tab_bar->Tabs).Size <= iVar6)) break;
      if (((pIVar2[uVar7].Flags & 0x20U) != 0) ||
         (((pIVar2[uVar7].Flags ^ src_tab->Flags) & 0xc0U) != 0)) break;
      fVar13 = pIVar2[uVar7].Offset + fVar11;
      fVar1 = (GImGui->Style).ItemInnerSpacing.x;
      bVar3 = pIVar2[uVar7].Width + fVar13 + fVar1 <= fVar10;
      if (fVar10 < fVar12) {
        bVar3 = fVar10 <= fVar13 - fVar1;
      }
      iVar8 = iVar6;
      if (!bVar3) break;
      uVar4 = (ulong)(iVar6 + (uint)(fVar12 <= fVar10) * 2 + -1);
      uVar9 = uVar7;
    }
    iVar8 = iVar8 - (int)uVar5;
    if (iVar8 != 0) {
      tab_bar->ReorderRequestTabId = src_tab->ID;
      tab_bar->ReorderRequestOffset = (ImS16)iVar8;
    }
  }
  return;
}

Assistant:

void ImGui::TabBarQueueReorderFromMousePos(ImGuiTabBar* tab_bar, const ImGuiTabItem* src_tab, ImVec2 mouse_pos)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(tab_bar->ReorderRequestTabId == 0);
    if ((tab_bar->Flags & ImGuiTabBarFlags_Reorderable) == 0)
        return;

    const bool is_central_section = (src_tab->Flags & ImGuiTabItemFlags_SectionMask_) == 0;
    const float bar_offset = tab_bar->BarRect.Min.x - (is_central_section ? tab_bar->ScrollingTarget : 0);

    // Count number of contiguous tabs we are crossing over
    const int dir = (bar_offset + src_tab->Offset) > mouse_pos.x ? -1 : +1;
    const int src_idx = tab_bar->Tabs.index_from_ptr(src_tab);
    int dst_idx = src_idx;
    for (int i = src_idx; i >= 0 && i < tab_bar->Tabs.Size; i += dir)
    {
        // Reordered tabs must share the same section
        const ImGuiTabItem* dst_tab = &tab_bar->Tabs[i];
        if (dst_tab->Flags & ImGuiTabItemFlags_NoReorder)
            break;
        if ((dst_tab->Flags & ImGuiTabItemFlags_SectionMask_) != (src_tab->Flags & ImGuiTabItemFlags_SectionMask_))
            break;
        dst_idx = i;

        // Include spacing after tab, so when mouse cursor is between tabs we would not continue checking further tabs that are not hovered.
        const float x1 = bar_offset + dst_tab->Offset - g.Style.ItemInnerSpacing.x;
        const float x2 = bar_offset + dst_tab->Offset + dst_tab->Width + g.Style.ItemInnerSpacing.x;
        //GetForegroundDrawList()->AddRect(ImVec2(x1, tab_bar->BarRect.Min.y), ImVec2(x2, tab_bar->BarRect.Max.y), IM_COL32(255, 0, 0, 255));
        if ((dir < 0 && mouse_pos.x > x1) || (dir > 0 && mouse_pos.x < x2))
            break;
    }

    if (dst_idx != src_idx)
        TabBarQueueReorder(tab_bar, src_tab, dst_idx - src_idx);
}